

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

string * __thiscall
program_options::invalid_syntax::get_template_abi_cxx11_
          (string *__return_storage_ptr__,invalid_syntax *this,kind_t kind)

{
  char *__s;
  allocator<char> local_9;
  
  if (kind - long_not_allowed < 7) {
    __s = &DAT_00117cac + *(int *)(&DAT_00117cac + (ulong)(kind - long_not_allowed) * 4);
  }
  else {
    __s = "unknown command line syntax error for \'%s\'";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string invalid_syntax::get_template(kind_t kind)
{
    // Initially, store the message in 'const char*' variable,
    // to avoid conversion to string in all cases.
    const char* msg;
    switch(kind)
    {
    case empty_adjacent_parameter:
        msg = "the argument for option '%canonical_option%' should follow immediately after the equal sign";
        break;
    case missing_parameter:
        msg = "the required argument for option '%canonical_option%' is missing";
        break;
    case unrecognized_line:
        msg = "the options configuration file contains an invalid line '%invalid_line%'";
        break;
    // none of the following are currently used:
    case long_not_allowed:
        msg = "the unabbreviated option '%canonical_option%' is not valid";
        break;
    case long_adjacent_not_allowed:
        msg = "the unabbreviated option '%canonical_option%' does not take any arguments";
        break;
    case short_adjacent_not_allowed:
        msg = "the abbreviated option '%canonical_option%' does not take any arguments";
        break;
    case extra_parameter:
        msg = "option '%canonical_option%' does not take any arguments";
        break;
    default:
        msg = "unknown command line syntax error for '%s'";
    }
    return msg;
}